

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_insert.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalInsert::LogicalInsert
          (LogicalInsert *this,ClientContext *context,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *table_info)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  Binder *this_00;
  shared_ptr<duckdb::Binder,_true> binder;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  undefined1 auStack_78 [24];
  pointer puStack_60;
  pointer local_58;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  local_48;
  
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_INSERT);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalInsert_024acca0;
  (this->insert_values).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->insert_values).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->insert_values).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_index_map).internal_vector.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->column_index_map).internal_vector.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->column_index_map).internal_vector.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->expected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (table_info);
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (table_info);
  pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (table_info);
  auStack_78._16_8_ =
       Catalog::GetEntry<duckdb::TableCatalogEntry>
                 (context,&pCVar1->catalog,&pCVar2->schema,(string *)(pCVar3 + 1),THROW_EXCEPTION,
                  (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::TableCatalogEntry,_true> *)(auStack_78 + 0x10));
  this->table = (TableCatalogEntry *)auStack_78._16_8_;
  (this->expected_set_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expected_set_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expected_set_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bound_defaults).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bound_defaults).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bound_defaults).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bound_constraints).
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bound_constraints).
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bound_constraints).
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->on_conflict_filter)._M_h._M_buckets = &(this->on_conflict_filter)._M_h._M_single_bucket;
  (this->on_conflict_filter)._M_h._M_bucket_count = 1;
  (this->on_conflict_filter)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->on_conflict_filter)._M_h._M_element_count = 0;
  (this->on_conflict_filter)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  switchD_01306cb1::default(&(this->on_conflict_filter)._M_h._M_rehash_policy._M_next_resize,0,0x88)
  ;
  Binder::CreateBinder
            ((Binder *)auStack_78,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  this_00 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)auStack_78);
  Binder::BindConstraints
            ((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)&local_48,this_00,this->table);
  auStack_78._16_8_ =
       (this->bound_constraints).
       super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puStack_60 = (this->bound_constraints).
               super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (this->bound_constraints).
             super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->bound_constraints).
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->bound_constraints).
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->bound_constraints).
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             *)(auStack_78 + 0x10));
  ::std::
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ::~vector(&local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78._8_8_);
  }
  return;
}

Assistant:

LogicalInsert::LogicalInsert(ClientContext &context, const unique_ptr<CreateInfo> table_info)
    : LogicalOperator(LogicalOperatorType::LOGICAL_INSERT),
      table(Catalog::GetEntry<TableCatalogEntry>(context, table_info->catalog, table_info->schema,
                                                 table_info->Cast<CreateTableInfo>().table)) {
	auto binder = Binder::CreateBinder(context);
	bound_constraints = binder->BindConstraints(table);
}